

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

int HFSubConsumer::waitTimer(zloop_t *loop,int timer_id,void *arg)

{
  HFSubConsumer *self;
  
  if (*(char *)((long)arg + 0x3b0) == '\x01') {
    *(undefined1 *)((long)arg + 0x3b0) = 0;
    zstr_send(*(void **)((long)arg + 0xa0),"X");
  }
  return 0;
}

Assistant:

int HFSubConsumer::waitTimer(zloop_t *loop, int timer_id, void *arg){
    //If timeout happens before message comes in
    HFSubConsumer *self = (HFSubConsumer*)arg;
    if(self->waiting){
        self->waiting = false;
        zstr_send(self->usrpipe, "X");
    }
    return 0;
}